

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,false,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
::operator()(BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,false,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
             *this,int it)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 in_RAX;
  reference piVar4;
  int local_28;
  int local_24;
  
  puVar3 = *(undefined8 **)this;
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),it);
  piVar4 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)*puVar3,&local_28);
  iVar1 = *piVar4;
  iVar2 = *(int *)(puVar3 + 1);
  _local_28 = CONCAT44(it,local_28);
  piVar4 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     (*(View<int,_false,_std::allocator<unsigned_long>_> **)(this + 8),&local_24);
  return iVar1 * iVar2 * *piVar4;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }